

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenWorkItem.h
# Opt level: O2

void __thiscall CodeGenWorkItem::VerifyJitMode(CodeGenWorkItem *this)

{
  code *pcVar1;
  bool bVar2;
  char cVar3;
  uint sourceContextId;
  LocalFunctionId functionId;
  undefined4 *puVar4;
  
  cVar3 = (this->jitData).jitMode;
  if (cVar3 == '\x03') {
LAB_003eaaef:
    bVar2 = Js::FunctionBody::DoSimpleJit(this->functionBody);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/CodeGenWorkItem.h"
                         ,0xa0,
                         "(GetJitMode() != ExecutionMode::SimpleJit || GetFunctionBody()->DoSimpleJit())"
                         ,
                         "GetJitMode() != ExecutionMode::SimpleJit || GetFunctionBody()->DoSimpleJit()"
                        );
      if (!bVar2) goto LAB_003eabe8;
      *puVar4 = 0;
    }
    cVar3 = (this->jitData).jitMode;
LAB_003eab54:
    if (cVar3 != '\x04') {
      return;
    }
  }
  else if (cVar3 != '\x04') {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/CodeGenWorkItem.h"
                       ,0x9f,
                       "(GetJitMode() == ExecutionMode::SimpleJit || GetJitMode() == ExecutionMode::FullJit)"
                       ,
                       "GetJitMode() == ExecutionMode::SimpleJit || GetJitMode() == ExecutionMode::FullJit"
                      );
    if (!bVar2) goto LAB_003eabe8;
    *puVar4 = 0;
    cVar3 = (this->jitData).jitMode;
    if (cVar3 == '\x03') goto LAB_003eaaef;
    goto LAB_003eab54;
  }
  sourceContextId = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)this->functionBody);
  functionId = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)this->functionBody);
  bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01441eb0,FullJitPhase,sourceContextId,functionId);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/CodeGenWorkItem.h"
                       ,0xa1,
                       "(GetJitMode() != ExecutionMode::FullJit || !Js::Configuration::Global.flags.Off.IsEnabled(((Js::FullJitPhase)), ((GetFunctionBody())->GetSourceContextId()), ((GetFunctionBody())->GetLocalFunctionId())))"
                       ,
                       "GetJitMode() != ExecutionMode::FullJit || !PHASE_OFF(Js::FullJitPhase, GetFunctionBody())"
                      );
    if (!bVar2) {
LAB_003eabe8:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  return;
}

Assistant:

void VerifyJitMode() const
    {
        Assert(GetJitMode() == ExecutionMode::SimpleJit || GetJitMode() == ExecutionMode::FullJit);
        Assert(GetJitMode() != ExecutionMode::SimpleJit || GetFunctionBody()->DoSimpleJit());
        Assert(GetJitMode() != ExecutionMode::FullJit || !PHASE_OFF(Js::FullJitPhase, GetFunctionBody()));
    }